

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

MD_LINE * md_lookup_line(MD_OFFSET off,MD_LINE *lines,MD_SIZE n_lines,MD_SIZE *p_line_index)

{
  uint uVar1;
  MD_LINE *pMVar2;
  MD_LINE *line;
  MD_SIZE pivot;
  MD_SIZE hi;
  MD_SIZE lo;
  MD_SIZE *p_line_index_local;
  MD_SIZE n_lines_local;
  MD_LINE *lines_local;
  MD_OFFSET off_local;
  
  lo = 0;
  hi = n_lines - 1;
  while( true ) {
    while( true ) {
      if (hi < lo) {
        return (MD_LINE *)0x0;
      }
      uVar1 = lo + hi >> 1;
      pMVar2 = lines + uVar1;
      if (off < pMVar2->beg) break;
      if (off <= pMVar2->end) {
        if (p_line_index == (MD_SIZE *)0x0) {
          return pMVar2;
        }
        *p_line_index = uVar1;
        return pMVar2;
      }
      lo = uVar1 + 1;
    }
    if ((hi == 0) || (lines[hi - 1].end < off)) break;
    hi = uVar1 - 1;
  }
  if (p_line_index == (MD_SIZE *)0x0) {
    return pMVar2;
  }
  *p_line_index = uVar1;
  return pMVar2;
}

Assistant:

static const MD_LINE*
md_lookup_line(OFF off, const MD_LINE* lines, MD_SIZE n_lines, MD_SIZE* p_line_index)
{
    MD_SIZE lo, hi;
    MD_SIZE pivot;
    const MD_LINE* line;

    lo = 0;
    hi = n_lines - 1;
    while(lo <= hi) {
        pivot = (lo + hi) / 2;
        line = &lines[pivot];

        if(off < line->beg) {
            if(hi == 0  ||  lines[hi-1].end < off) {
                if(p_line_index != NULL)
                    *p_line_index = pivot;
                return line;
            }
            hi = pivot - 1;
        } else if(off > line->end) {
            lo = pivot + 1;
        } else {
            if(p_line_index != NULL)
                *p_line_index = pivot;
            return line;
        }
    }

    return NULL;
}